

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxiliaryMethods.cpp
# Opt level: O0

GraphDatabase * AuxiliaryMethods::read_graph_txt_file(string *data_set_name)

{
  uint uVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  byte bVar2;
  bool bVar3;
  istream *piVar4;
  reference pvVar5;
  _Node_iterator_base<std::pair<const_int,_int>,_false> edgeList;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  Graph *this;
  reference pvVar7;
  vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_> *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<int,_int>_&>::value,_pair<iterator,_bool>_> _Var8;
  Node w;
  Node v;
  uint off;
  uint graph_num;
  vector<int,_std::allocator<int>_> r;
  ifstream edge_file;
  vector<int,_std::allocator<int>_> edges;
  Graph new_graph;
  EdgeList edge_list;
  unsigned_long j;
  Labels l;
  unsigned_long s;
  pair<int,_int> p;
  uint i;
  int num_nodes;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  offset;
  ifstream labels;
  Labels node_labels;
  string label;
  bool label_data;
  uint num_graphs;
  ifstream myfile;
  vector<unsigned_int,_std::allocator<unsigned_int>_> graph_indicator;
  string line;
  GraphDatabase *graph_database;
  Node in_stack_fffffffffffff5a8;
  Node in_stack_fffffffffffff5ac;
  undefined4 in_stack_fffffffffffff5b0;
  int in_stack_fffffffffffff5b4;
  value_type *in_stack_fffffffffffff5b8;
  vector<int,_std::allocator<int>_> *this_00;
  undefined7 in_stack_fffffffffffff5c0;
  undefined1 in_stack_fffffffffffff5c7;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffff5c8;
  Node in_stack_fffffffffffff5d0;
  Node in_stack_fffffffffffff5d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5f0;
  undefined7 in_stack_fffffffffffff5f8;
  undefined1 in_stack_fffffffffffff5ff;
  unsigned_long in_stack_fffffffffffff608;
  undefined7 in_stack_fffffffffffff610;
  undefined1 in_stack_fffffffffffff617;
  string local_990 [32];
  vector<int,_std::allocator<int>_> local_970;
  string local_958 [32];
  string local_938 [32];
  string local_918 [32];
  string local_8f8 [32];
  istream local_8d8 [112];
  string *in_stack_fffffffffffff798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_648;
  int local_618;
  pair<int,_int> local_600;
  uint local_5f8;
  int local_5f4 [16];
  byte local_5b1;
  unsigned_long local_5b0;
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  istream local_528 [520];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_320;
  string local_308 [35];
  byte local_2e5;
  uint local_2e4;
  int local_2e0;
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  istream local_250 [520];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x11c90c);
  std::operator+((char *)CONCAT17(in_stack_fffffffffffff5ff,in_stack_fffffffffffff5f8),
                 in_stack_fffffffffffff5f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5b8,
                 (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5b8,
                 (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
  std::ifstream::ifstream(local_250,local_270,_S_in);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::~string(local_2d0);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    printf("%s","!!! Unable to open file !!!\n");
    exit(1);
  }
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_250,local_30);
    bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar3) break;
    local_2e0 = std::__cxx11::stoi((string *)
                                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),0);
    local_2e0 = local_2e0 + -1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (value_type *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
  }
  std::ifstream::close();
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
  local_2e4 = *pvVar5 + 1;
  local_2e5 = 1;
  std::__cxx11::string::string(local_308);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x11cbc4);
  std::operator+((char *)CONCAT17(in_stack_fffffffffffff5ff,in_stack_fffffffffffff5f8),
                 in_stack_fffffffffffff5f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5b8,
                 (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5b8,
                 (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
  std::ifstream::ifstream(local_528,local_548,_S_in);
  std::__cxx11::string::~string(local_548);
  std::__cxx11::string::~string(local_568);
  std::__cxx11::string::~string(local_588);
  std::__cxx11::string::~string(local_5a8);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    local_2e5 = 0;
  }
  else {
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_528,local_308);
      in_stack_fffffffffffff617 =
           std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!(bool)in_stack_fffffffffffff617) break;
      in_stack_fffffffffffff608 =
           std::__cxx11::stoul((string *)
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),0);
      local_5b0 = in_stack_fffffffffffff608;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
    }
    std::ifstream::close();
  }
  local_5b1 = 0;
  std::vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>::vector
            ((vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_> *)0x11ce27);
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)0x11ce34);
  local_5f4[0] = 0;
  for (local_5f8 = 0; local_5f8 < local_2e4; local_5f8 = local_5f8 + 1) {
    std::pair<int,_int>::pair<unsigned_int_&,_int_&,_true>(&local_600,&local_5f8,local_5f4);
    _Var8 = std::
            unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>
            ::insert<std::pair<int,int>&>
                      ((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                        *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
                       (pair<int,_int> *)in_stack_fffffffffffff5b8);
    edgeList._M_cur =
         (__node_type *)
         _Var8.first.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur;
    in_stack_fffffffffffff5ff = _Var8.second;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
    __first._M_current._4_4_ = in_stack_fffffffffffff5d4;
    __first._M_current._0_4_ = in_stack_fffffffffffff5d0;
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             count<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                       (__first,in_stack_fffffffffffff5c8,
                        (uint *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
    in_stack_fffffffffffff5f0 = pbVar6;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x11cf1f);
    if ((local_2e5 & 1) != 0) {
      for (local_648 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (long)local_5f4[0]; local_648 < pbVar6 + local_5f4[0];
          local_648 = local_648 + 1) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (&local_320,(size_type)local_648);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
                   (value_type_conflict1 *)in_stack_fffffffffffff5b8);
      }
    }
    local_618 = (int)pbVar6;
    local_5f4[0] = local_5f4[0] + local_618;
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)0x11cff4);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)edgeList._M_cur,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffff5ff,in_stack_fffffffffffff5f8));
    GraphLibrary::Graph::Graph
              ((Graph *)CONCAT17(in_stack_fffffffffffff617,in_stack_fffffffffffff610),
               (uint)(in_stack_fffffffffffff608 >> 0x20),(EdgeList *)edgeList._M_cur,
               (Labels *)CONCAT17(in_stack_fffffffffffff5ff,in_stack_fffffffffffff5f8));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
    std::vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>::push_back
              ((vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_> *)
               CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               in_stack_fffffffffffff5b8);
    GraphLibrary::Graph::~Graph
              ((Graph *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x11d120);
  std::operator+((char *)CONCAT17(in_stack_fffffffffffff5ff,in_stack_fffffffffffff5f8),
                 in_stack_fffffffffffff5f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5b8,
                 (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff5b8,
                 (char *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
  std::ifstream::ifstream(local_8d8,local_8f8,_S_in);
  std::__cxx11::string::~string(local_8f8);
  std::__cxx11::string::~string(local_918);
  std::__cxx11::string::~string(local_938);
  std::__cxx11::string::~string(local_958);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) != 0) {
    while( true ) {
      this = (Graph *)std::getline<char,std::char_traits<char>,std::allocator<char>>
                                (local_8d8,local_30);
      bVar3 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&(this->m_adjacency_lists).
                                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                *(long *)&(this->m_adjacency_lists).
                                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl));
      in_stack_fffffffffffff5d4 = CONCAT13(bVar3,(int3)in_stack_fffffffffffff5d4);
      if (!bVar3) break;
      std::__cxx11::string::string(local_990,local_30);
      split_string(in_stack_fffffffffffff798);
      std::__cxx11::string::~string(local_990);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_970,0);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_48,(long)(*pvVar7 + -1));
      uVar1 = *pvVar5;
      std::
      unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::operator[]((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                   (key_type *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
      this_00 = &local_970;
      std::vector<int,_std::allocator<int>_>::operator[](this_00,0);
      std::vector<int,_std::allocator<int>_>::operator[](this_00,1);
      std::vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>::operator[]
                (in_RDI,(ulong)uVar1);
      in_stack_fffffffffffff5c7 =
           GraphLibrary::Graph::has_edge(this,in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0);
      if (!(bool)in_stack_fffffffffffff5c7) {
        std::vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>::operator[]
                  (in_RDI,(ulong)uVar1);
        GraphLibrary::Graph::add_edge
                  ((Graph *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                   in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8);
      }
      in_stack_fffffffffffff5b4 =
           std::__cxx11::stoi((string *)
                              CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                              (size_t *)
                              CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),0);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
    }
    std::ifstream::close();
    local_5b1 = 1;
    std::ifstream::~ifstream(local_8d8);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
    std::
    unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                      *)0x11d56d);
    if ((local_5b1 & 1) == 0) {
      std::vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>::~vector
                ((vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_> *)
                 CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
    }
    std::ifstream::~ifstream(local_528);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
    std::__cxx11::string::~string(local_308);
    std::ifstream::~ifstream(local_250);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
    std::__cxx11::string::~string(local_30);
    return in_RDI;
  }
  printf("%s","!!! Unable to open file !!!\n");
  exit(1);
}

Assistant:

GraphDatabase read_graph_txt_file(const string data_set_name) {
        string line;
        vector<uint> graph_indicator;
        ifstream myfile(
                "/home/morris/amenability_test/data_sets/" + data_set_name + "/" + data_set_name +
                "_graph_indicator.txt");
        if (myfile.is_open()) {
            while (getline(myfile, line)) {
                graph_indicator.push_back(stoi(line) - 1);
            }
            myfile.close();
        } else {
            printf("%s", "!!! Unable to open file !!!\n");
            exit(EXIT_FAILURE);
        }

        uint num_graphs = graph_indicator.back() + 1;

        // Get labels from for each node.
        bool label_data = true;
        string label;
        Labels node_labels;
        ifstream labels(
                "/home/morris/amenability_test/data_sets/" + data_set_name + "/" + data_set_name + "_node_labels.txt");
        if (labels.is_open()) {
            while (getline(labels, label)) {
                node_labels.push_back(stoul(label));
            }
            myfile.close();
        } else {
            label_data = false;
        }

        GraphDatabase graph_database;
        unordered_map<int, int> offset;
        int num_nodes = 0;

        // Add vertices to each graph in graph database and assign labels.
        for (uint i = 0; i < num_graphs; ++i) {
            pair<int, int> p(i, num_nodes);
            offset.insert(p);
            unsigned long s = count(graph_indicator.begin(), graph_indicator.end(), i);

            Labels l;
            if (label_data) {
                for (unsigned long j = num_nodes; j < s + num_nodes; ++j) {
                    l.push_back(node_labels[j]);
                }
            }

            num_nodes += s;
            EdgeList edge_list;

            Graph new_graph(s, edge_list, l);
            graph_database.push_back(new_graph);
        }

        // Insert edges for each graph.
        vector<int> edges;
        ifstream edge_file(
                "/home/morris/amenability_test/data_sets/" + data_set_name + "/" + data_set_name + "_A.txt");
        if (edge_file.is_open()) {
            while (getline(edge_file, line)) {
                vector<int> r = split_string(line);

                uint graph_num = graph_indicator[r[0] - 1];
                uint off = offset[graph_num];
                Node v = r[0] - 1 - off;
                Node w = r[1] - 1 - off;

                if (!graph_database[graph_num].has_edge(v, w)) {
                    graph_database[graph_num].add_edge(v, w);
                }
                edges.push_back(stoi(line));
            }
            edge_file.close();
        } else {
            printf("%s", "!!! Unable to open file !!!\n");
            exit(EXIT_FAILURE);
        }

        return graph_database;
    }